

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

uint8_t __thiscall icu_63::ReorderingBuffer::previousCC(ReorderingBuffer *this)

{
  UChar UVar1;
  UChar *pUVar2;
  uint local_1c;
  UChar c2;
  UChar32 c;
  ReorderingBuffer *this_local;
  
  this->codePointLimit = this->codePointStart;
  if (this->reorderStart < this->codePointStart) {
    pUVar2 = this->codePointStart;
    this->codePointStart = pUVar2 + -1;
    local_1c = (uint)(ushort)pUVar2[-1];
    if ((((local_1c & 0xfffffc00) == 0xdc00) && (this->start < this->codePointStart)) &&
       (UVar1 = this->codePointStart[-1], (UVar1 & 0xfc00U) == 0xd800)) {
      this->codePointStart = this->codePointStart + -1;
      local_1c = (uint)(ushort)UVar1 * 0x400 + local_1c + 0xfca02400;
    }
    this_local._7_1_ = Normalizer2Impl::getCCFromYesOrMaybeCP(this->impl,local_1c);
  }
  else {
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

uint8_t ReorderingBuffer::previousCC() {
    codePointLimit=codePointStart;
    if(reorderStart>=codePointStart) {
        return 0;
    }
    UChar32 c=*--codePointStart;
    UChar c2;
    if(U16_IS_TRAIL(c) && start<codePointStart && U16_IS_LEAD(c2=*(codePointStart-1))) {
        --codePointStart;
        c=U16_GET_SUPPLEMENTARY(c2, c);
    }
    return impl.getCCFromYesOrMaybeCP(c);
}